

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall imrt::Station::generateIntensity(Station *this)

{
  long lVar1;
  int iVar2;
  pair<int,_int> pVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  clearIntensity(this);
  if (0 < this->max_apertures) {
    lVar4 = 0;
    do {
      iVar2 = Collimator::getXdim(this->collimator);
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          pVar3 = Collimator::getActiveRange(this->collimator,(int)lVar5,this->angle);
          if (-1 < pVar3.first) {
            lVar1 = *(long *)&(this->A).
                              super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar4].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data;
            iVar2 = *(int *)(lVar1 + lVar5 * 8);
            lVar6 = (long)iVar2;
            if ((-1 < lVar6) && (iVar2 <= *(int *)(lVar1 + 4 + lVar5 * 8))) {
              iVar2 = iVar2 + -1;
              do {
                change_intensity(this,(int)lVar5,(int)lVar6,
                                 (this->I).p[lVar5][lVar6] +
                                 (this->intensity).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar4],
                                 (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  *)0x0);
                lVar6 = lVar6 + 1;
                iVar2 = iVar2 + 1;
              } while (iVar2 < *(int *)(*(long *)&(this->A).
                                                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar5 * 8))
              ;
            }
          }
          lVar5 = lVar5 + 1;
          iVar2 = Collimator::getXdim(this->collimator);
        } while (lVar5 < iVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->max_apertures);
  }
  return;
}

Assistant:

void Station::generateIntensity(){
    pair <int,int>aux;
    clearIntensity();
    //printIntensity();
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        aux = collimator.getActiveRange(i,angle);
        if (aux.first<0 || A[a][i].first<0) continue;
        //for (int j=aux.first; j<=aux.second; j++) {
        for (int j=A[a][i].first; j<=A[a][i].second; j++) {
          //if (j>=A[a][i].first && j<=A[a][i].second){
            //cout << "a:" <<a << " i:" << i << " j:" <<j << " to add:" <<  intensity[a] << " on:" << I(i,j) <<  endl;
            change_intensity(i, j, I(i,j)+intensity[a]);
          //}
        }
      }
    }
  }